

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_binding.cpp
# Opt level: O1

BindingAlias *
duckdb::Binding::GetAlias
          (BindingAlias *__return_storage_ptr__,string *explicit_alias,StandardEntry *entry)

{
  pointer pcVar1;
  string local_38;
  
  if (explicit_alias->_M_string_length == 0) {
    BindingAlias::BindingAlias(__return_storage_ptr__,entry);
  }
  else {
    pcVar1 = (explicit_alias->_M_dataplus)._M_p;
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_38,pcVar1,pcVar1 + explicit_alias->_M_string_length);
    BindingAlias::BindingAlias(__return_storage_ptr__,&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

BindingAlias Binding::GetAlias(const string &explicit_alias, const StandardEntry &entry) {
	if (!explicit_alias.empty()) {
		return BindingAlias(explicit_alias);
	}
	// no explicit alias provided - generate from entry
	return BindingAlias(entry);
}